

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringconvert.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
string::convert<char,std::__cxx11::wstring>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,string *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *src)

{
  size_type from;
  size_t __n;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  __const_iterator local_a0;
  __const_iterator local_98;
  __tuple_element_t<1UL,_tuple<__normal_iterator<const_wchar_t_*,_basic_string<wchar_t,_char_traits<wchar_t>,_allocator<wchar_t>_>_>,___normal_iterator<char_*,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>_>
  *local_90;
  type *dused;
  type *sused;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_68;
  tuple<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60 [2];
  allocator<char> local_39;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dst;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *src_local;
  
  dst.field_2._8_8_ = this;
  from = std::size<std::__cxx11::wstring>
                   ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                    this);
  __n = utfconvertor<4,_1>::maxsize(from);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__n,'\0',&local_39);
  std::allocator<char>::~allocator(&local_39);
  local_68._M_current =
       (wchar_t *)
       std::begin<std::__cxx11::wstring>
                 ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                  dst.field_2._8_8_);
  local_70._M_current =
       (char *)std::end<std::__cxx11::wstring>
                         ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)dst.field_2._8_8_);
  local_78._M_current =
       (char *)std::begin<std::__cxx11::string>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
  sused = (type *)std::end<std::__cxx11::string>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_38);
  utfconvertor<4,1>::
  convert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>
            ((__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              )local_60,local_68,local_70,local_78);
  dused = (type *)std::
                  get<0ul,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                            (local_60);
  local_90 = std::
             get<1ul,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                       (local_60);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_98,local_90);
  local_a8._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_a0,&local_a8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,local_98,
             local_a0);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline auto convert(const SRC& src)
{
    using SRCCHAR = typename SRC::value_type;

    std::basic_string<DSTCHAR> dst(utfconvertor<sizeof(SRCCHAR), sizeof(DSTCHAR)>::maxsize(std::size(src)), DSTCHAR(0));

    auto [ sused, dused ] = utfconvertor<sizeof(SRCCHAR), sizeof(DSTCHAR)>::convert(std::begin(src), std::end(src), std::begin(dst), std::end(dst));

    dst.erase(dused, dst.end());
    return dst;
}